

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_rem_aarch64(float64 a,float64 b,float_status *status)

{
  int iVar1;
  float64 fVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong local_70;
  uint64_t local_68;
  int64_t sigMean;
  uint64_t alternateASig;
  uint64_t q;
  uint64_t bSig;
  uint64_t aSig;
  int expDiff;
  int bExp;
  int aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  
  _aExp = status;
  status_local = (float_status *)b;
  b_local = a;
  b_local = float64_squash_input_denormal_aarch64(a,status);
  status_local = (float_status *)float64_squash_input_denormal_aarch64((float64)status_local,_aExp);
  bSig = extractFloat64Frac(b_local);
  expDiff = extractFloat64Exp(b_local);
  bExp._3_1_ = extractFloat64Sign(b_local);
  q = extractFloat64Frac((float64)status_local);
  aSig._4_4_ = extractFloat64Exp((float64)status_local);
  if (expDiff == 0x7ff) {
    if ((bSig == 0) && ((aSig._4_4_ != 0x7ff || (q == 0)))) {
      float_raise_aarch64('\x01',_aExp);
      a_local = float64_default_nan_aarch64(_aExp);
    }
    else {
      a_local = propagateFloat64NaN(b_local,(float64)status_local,_aExp);
    }
  }
  else if (aSig._4_4_ == 0x7ff) {
    if (q == 0) {
      a_local = b_local;
    }
    else {
      a_local = propagateFloat64NaN(b_local,(float64)status_local,_aExp);
    }
  }
  else {
    if (aSig._4_4_ == 0) {
      if (q == 0) {
        float_raise_aarch64('\x01',_aExp);
        fVar2 = float64_default_nan_aarch64(_aExp);
        return fVar2;
      }
      normalizeFloat64Subnormal(q,(int *)((long)&aSig + 4),&q);
    }
    if (expDiff == 0) {
      if (bSig == 0) {
        return b_local;
      }
      normalizeFloat64Subnormal(bSig,&expDiff,&bSig);
    }
    iVar1 = expDiff - aSig._4_4_;
    bSig = (bSig | 0x10000000000000) << 0xb;
    uVar3 = q | 0x10000000000000;
    q = uVar3 * 0x800;
    if (iVar1 < 0) {
      if (iVar1 < -1) {
        return b_local;
      }
      bSig = bSig >> 1;
    }
    alternateASig = (uint64_t)(int)(uint)(q <= bSig);
    if (alternateASig != 0) {
      bSig = bSig + uVar3 * -0x800;
    }
    for (aSig._0_4_ = iVar1 + -0x40; 0 < (int)aSig; aSig._0_4_ = (int)aSig + -0x3e) {
      local_68 = estimateDiv128To64(bSig,0,q);
      if (local_68 < 3) {
        local_68 = 0;
      }
      else {
        local_68 = local_68 - 2;
      }
      alternateASig = local_68;
      bSig = -((q >> 2) * local_68);
    }
    aSig._0_4_ = (int)aSig + 0x40;
    if ((int)aSig < 1) {
      q = q >> 2;
      uVar4 = bSig >> 2;
    }
    else {
      uVar4 = estimateDiv128To64(bSig,0,q);
      if (uVar4 < 3) {
        local_70 = 0;
      }
      else {
        local_70 = uVar4 - 2;
      }
      alternateASig = local_70 >> (0x40U - (char)(int)aSig & 0x3f);
      q = q >> 2;
      uVar4 = ((bSig >> 1) << ((char)(int)aSig - 1U & 0x3f)) - q * alternateASig;
    }
    do {
      bSig = uVar4;
      alternateASig = alternateASig + 1;
      uVar4 = bSig - q;
    } while (-1 < (long)uVar4);
    if (((long)(uVar4 + bSig) < 0) || ((uVar4 + bSig == 0 && ((alternateASig & 1) != 0)))) {
      uVar4 = bSig;
    }
    bSig = uVar4;
    bExp._2_1_ = (long)bSig < 0;
    if ((bool)bExp._2_1_) {
      bSig = -bSig;
    }
    a_local = normalizeRoundAndPackFloat64(bExp._3_1_ ^ bExp._2_1_,aSig._4_4_,bSig,_aExp);
  }
  return a_local;
}

Assistant:

float64 float64_rem(float64 a, float64 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint64_t aSig, bSig;
    uint64_t q, alternateASig;
    int64_t sigMean;

    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    bSig = extractFloat64Frac( b );
    bExp = extractFloat64Exp( b );
    if ( aExp == 0x7FF ) {
        if ( aSig || ( ( bExp == 0x7FF ) && bSig ) ) {
            return propagateFloat64NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( bExp == 0x7FF ) {
        if (bSig) {
            return propagateFloat64NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float64_default_nan(status);
        }
        normalizeFloat64Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig = (aSig | UINT64_C(0x0010000000000000)) << 11;
    bSig = (bSig | UINT64_C(0x0010000000000000)) << 11;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        aSig >>= 1;
    }
    q = ( bSig <= aSig );
    if ( q ) aSig -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
#ifdef _MSC_VER
        aSig = 0ULL - ( ( bSig>>2 ) * q );
#else
        aSig = - ( ( bSig>>2 ) * q );
#endif
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        bSig >>= 2;
        aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
    }
    else {
        aSig >>= 2;
        bSig >>= 2;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int64_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int64_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0 - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat64(aSign ^ zSign, bExp, aSig, status);

}